

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing.cpp
# Opt level: O1

void listing_load_inputfile(char *src_filename)

{
  char cVar1;
  string line;
  ifstream src;
  value_type local_248;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream((istream *)local_228,src_filename,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 2) == 0) {
    do {
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) +
                              (char)(istream *)local_228);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_228,(string *)&local_248,cVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&srcfile_abi_cxx11_,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
    } while ((abStack_208[*(long *)(local_228[0] + -0x18)] & 2) == 0);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void listing_load_inputfile(const char *src_filename)
{
	try {
		std::ifstream src (src_filename);
		while ( ! src.eof()) {
			std::string line;
			getline(src, line);
			srcfile.push_back(line);
		}
		src.close();
	} catch (std::ios_base::failure& e) {
		std::cerr << "IO exception: " << e.what() << endl;
	}
}